

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

QString * __thiscall
QResourceFileEngine::fileName
          (QString *__return_storage_ptr__,QResourceFileEngine *this,FileName file)

{
  QAbstractFileEnginePrivate *pQVar1;
  qsizetype qVar2;
  char *pcVar3;
  FileError *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  qsizetype qStack_50;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  if ((file == AbsolutePathName) || (file == PathName)) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (file == AbsolutePathName) {
      QResource::absoluteFilePath((QString *)&local_48,(QResource *)&pQVar1[1].fileError);
    }
    else {
      QResource::fileName((QString *)&local_48,(QResource *)&pQVar1[1].fileError);
    }
    qVar2 = QString::lastIndexOf((QString *)&local_48,(QChar)0x2f,CaseSensitive);
    if (qVar2 == -1) {
      pcVar3 = ":";
      qStack_50 = 1;
    }
    else {
      if (1 < qVar2) {
        QString::left(__return_storage_ptr__,(QString *)&local_48,qVar2);
        goto LAB_002389bd;
      }
      pcVar3 = ":/";
      qStack_50 = 2;
    }
    latin1.m_data = pcVar3;
    latin1.m_size = qStack_50;
    QString::QString(__return_storage_ptr__,latin1);
LAB_002389bd:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  else {
    if (file != BaseName) {
      if ((file & ~BaseName) != CanonicalName) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QResource::fileName(__return_storage_ptr__,(QResource *)&pQVar1[1].fileError);
          return __return_storage_ptr__;
        }
        goto LAB_00238a18;
      }
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QResource::absoluteFilePath((QString *)&local_48,(QResource *)&pQVar1[1].fileError);
      if ((file == CanonicalPathName) &&
         (qVar2 = QString::lastIndexOf((QString *)&local_48,(QChar)0x2f,CaseSensitive), qVar2 != -1)
         ) {
        QString::left(__return_storage_ptr__,(QString *)&local_48,qVar2);
      }
      else {
        (__return_storage_ptr__->d).d = local_48.d;
        (__return_storage_ptr__->d).ptr = local_48.ptr;
        (__return_storage_ptr__->d).size = local_48.size;
        if (local_48.d != (Data *)0x0) {
          LOCK();
          ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      goto LAB_002389bd;
    }
    this_00 = &pQVar1[1].fileError;
    QResource::fileName((QString *)&local_48,(QResource *)this_00);
    qVar2 = QString::lastIndexOf((QString *)&local_48,(QChar)0x2f,CaseSensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (qVar2 != -1) {
      QResource::fileName((QString *)&local_48,(QResource *)this_00);
      QString::mid(__return_storage_ptr__,(QString *)&local_48,qVar2 + 1,-1);
      goto LAB_002389bd;
    }
    QResource::fileName(__return_storage_ptr__,(QResource *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_00238a18:
  __stack_chk_fail();
}

Assistant:

QString QResourceFileEngine::fileName(FileName file) const
{
    Q_D(const QResourceFileEngine);
    if (file == BaseName) {
        const qsizetype slash = d->resource.fileName().lastIndexOf(u'/');
        if (slash == -1)
            return d->resource.fileName();
        return d->resource.fileName().mid(slash + 1);
    } else if (file == PathName || file == AbsolutePathName) {
        const QString path = (file == AbsolutePathName) ? d->resource.absoluteFilePath()
                                                        : d->resource.fileName();
        const qsizetype slash = path.lastIndexOf(u'/');
        if (slash == -1)
            return ":"_L1;
        else if (slash <= 1)
            return ":/"_L1;
        return path.left(slash);

    } else if (file == CanonicalName || file == CanonicalPathName) {
        const QString absoluteFilePath = d->resource.absoluteFilePath();
        if (file == CanonicalPathName) {
            const qsizetype slash = absoluteFilePath.lastIndexOf(u'/');
            if (slash != -1)
                return absoluteFilePath.left(slash);
        }
        return absoluteFilePath;
    }
    return d->resource.fileName();
}